

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode cf_setup_create(Curl_cfilter **pcf,Curl_easy *data,Curl_dns_entry *remotehost,int transport
                        ,int ssl_mode)

{
  CURLcode CVar1;
  undefined4 *ctx;
  Curl_cfilter *pCVar2;
  Curl_cfilter *cf;
  
  cf = (Curl_cfilter *)0x0;
  ctx = (undefined4 *)(*Curl_ccalloc)(1,0x18);
  if (ctx == (undefined4 *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
    ctx = (undefined4 *)0x0;
    pCVar2 = (Curl_cfilter *)0x0;
  }
  else {
    *ctx = 0;
    *(Curl_easy **)(ctx + 2) = data;
    ctx[4] = transport;
    ctx[5] = (int)remotehost;
    CVar1 = Curl_cf_create(&cf,&Curl_cft_setup,ctx);
    pCVar2 = (Curl_cfilter *)0x0;
    if (CVar1 == CURLE_OK) {
      ctx = (undefined4 *)0x0;
      pCVar2 = cf;
    }
  }
  *pcf = pCVar2;
  (*Curl_cfree)(ctx);
  return CVar1;
}

Assistant:

static CURLcode cf_setup_create(struct Curl_cfilter **pcf,
                                struct Curl_easy *data,
                                const struct Curl_dns_entry *remotehost,
                                int transport,
                                int ssl_mode)
{
  struct Curl_cfilter *cf = NULL;
  struct cf_setup_ctx *ctx;
  CURLcode result = CURLE_OK;

  (void)data;
  ctx = calloc(1, sizeof(*ctx));
  if(!ctx) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }
  ctx->state = CF_SETUP_INIT;
  ctx->remotehost = remotehost;
  ctx->ssl_mode = ssl_mode;
  ctx->transport = transport;

  result = Curl_cf_create(&cf, &Curl_cft_setup, ctx);
  if(result)
    goto out;
  ctx = NULL;

out:
  *pcf = result? NULL : cf;
  free(ctx);
  return result;
}